

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focus_attack_strategy.cpp
# Opt level: O2

void __thiscall
FocusAttackStrategy::generateActions(FocusAttackStrategy *this,PlayerSight *sight,Actions *actions)

{
  Vec2 pos;
  pointer pPVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pPVar5;
  const_iterator __begin1;
  pointer pPVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if (this->field_0xc == '\0') {
    pPVar1 = (sight->unitInSight).super__Vector_base<PUnitInfo,_std::allocator<PUnitInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar4 = this->target;
    fVar7 = 1e+08;
    iVar3 = -1;
    pPVar6 = (sight->unitInSight).super__Vector_base<PUnitInfo,_std::allocator<PUnitInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (pPVar5 = pPVar6; pPVar5 != pPVar1; pPVar5 = pPVar5 + 1) {
      if (pPVar5->id == iVar4) goto LAB_0013ae6b;
      fVar8 = (pPVar5->pos).x - (sight->pos).x;
      fVar9 = (pPVar5->pos).y - (sight->pos).y;
      fVar8 = SQRT(fVar8 * fVar8 + fVar9 * fVar9);
      iVar2 = pPVar5->id;
      if (fVar7 <= fVar8) {
        fVar8 = fVar7;
        iVar2 = iVar3;
      }
      iVar3 = iVar2;
      fVar7 = fVar8;
    }
    this->target = iVar3;
    iVar4 = iVar3;
LAB_0013ae6b:
    if (iVar4 != -1) {
      for (; pPVar6 != pPVar1; pPVar6 = pPVar6 + 1) {
        if (pPVar6->id == this->target) {
          pos = pPVar6->pos;
          if ((sight->canSuckAttack == true) &&
             (fVar8 = pos.x - (sight->pos).x, fVar7 = pos.y - (sight->pos).y,
             SQRT(fVar8 * fVar8 + fVar7 * fVar7) <= 4.0)) {
            Actions::emplace(actions,SuckAttack,pPVar6->id,pos);
          }
          if (sight->canUseBomb == true) {
            if (sight->bombCount == 0) {
              Actions::emplace(actions,BuyItem,0,(Vec2)0x0);
            }
            Actions::emplace(actions,UseItem,0,pos);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FocusAttackStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    bool found = false;
    float dist = FINF;
    int nearest = -1;
    for (auto uinfo : sight.unitInSight)
    {
        if (uinfo.id == target)
        {
            found = true;
            break;
        }
        if ((uinfo.pos - sight.pos).length() < dist)
        {
            dist = (uinfo.pos - sight.pos).length();
            nearest = uinfo.id;
        }
    }
    if (!found)
        target = nearest;
    if (target == -1)
        return;
    
    for (auto uinfo : sight.unitInSight)
    {
        if (uinfo.id != target)
            continue;
        if (sight.canSuckAttack && (uinfo.pos - sight.pos).length() <= SuckRange)
            actions->emplace(SuckAttack, target, uinfo.pos);
        if (sight.canUseBomb)
        {
            if (sight.bombCount == 0)
                actions->emplace(BuyItem, BombItem, Vec2());
            actions->emplace(UseItem, BombItem, uinfo.pos);
        }
    }
}